

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenGetterForLookupByKey
          (string *__return_storage_ptr__,CSharpGenerator *this,StructDef *struct_def,
          FieldDef *key_field,string *data_buffer,string *offset)

{
  __type _Var1;
  string name;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Name_abi_cxx11_(&local_90,this,key_field);
  _Var1 = std::operator==(&local_90,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          struct_def);
  if (_Var1) {
    std::__cxx11::string::append((char *)&local_90);
  }
  GetObjectConstructor(&local_70,this,struct_def,data_buffer,offset);
  std::operator+(&local_50,&local_70,".");
  std::operator+(__return_storage_ptr__,&local_50,&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string GenGetterForLookupByKey(flatbuffers::StructDef &struct_def,
                                      flatbuffers::FieldDef *key_field,
                                      const std::string &data_buffer,
                                      const std::string &offset) const {
    // Use the generated type directly, to properly handle default values that
    // might not be written to the buffer.
    auto name = Name(*key_field);
    if (name == struct_def.name) { name += "_"; }
    return GetObjectConstructor(struct_def, data_buffer, offset) + "." + name;
  }